

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.cpp
# Opt level: O2

void __thiscall hta::Meta::Meta(Meta *this,json *config)

{
  duration<long,_std::ratio<1L,_1000000000L>_> args_1;
  duration<long,_std::ratio<1L,_1000000000L>_> args_1_00;
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  
  (this->interval_min).__r = 10000000000;
  (this->interval_max).__r = 0x7009d32da30000;
  this->interval_factor = 10;
  sVar1 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[13]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [13])"interval_min");
  if (sVar1 != 0) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)config,"interval_min");
    lVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<long,_long,_0>(pvVar2);
    (this->interval_min).__r = lVar3;
  }
  sVar1 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[16]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [16])"interval_factor");
  if (sVar1 != 0) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)config,"interval_factor");
    lVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<long,_long,_0>(pvVar2);
    this->interval_factor = lVar3;
  }
  sVar1 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[13]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [13])0x162b0f);
  if (sVar1 != 0) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)config,"interval_max");
    lVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<long,_long,_0>(pvVar2);
    (this->interval_max).__r = lVar3;
  }
  args_1.__r = (this->interval_min).__r;
  if (args_1.__r % this->interval_factor != 0) {
    throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,long>
              ("interval_min of ",args_1," not divisible by ",this->interval_factor);
  }
  if (args_1.__r < 1) {
    throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              ("interval_min not positive ",args_1);
  }
  args_1_00.__r = (this->interval_max).__r;
  if (args_1.__r <= args_1_00.__r) {
    return;
  }
  throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*>
            ("interval_max (",args_1_00,")not larger than interval_min (",args_1,")");
}

Assistant:

Meta::Meta(const json& config)
{
    if (config.count("interval_min"))
    {
        interval_min = Duration(config["interval_min"]);
    }
    if (config.count("interval_factor"))
    {
        interval_factor = config["interval_factor"];
    }
    if (config.count("interval_max"))
    {
        interval_max = Duration(config["interval_max"]);
    }
    if (interval_min.count() % interval_factor != 0)
    {
        throw_exception("interval_min of ", interval_min, " not divisible by ", interval_factor);
    }
    if (interval_min.count() <= 0)
    {
        throw_exception("interval_min not positive ", interval_min);
    }
    if (interval_max < interval_min)
    {
        throw_exception("interval_max (", interval_max, ")not larger than interval_min (",
                        interval_min, ")");
    }
}